

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  value_type vVar4;
  key_type kVar5;
  uint *lhs;
  AssertHelper *this_00;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht2_2;
  TypeParam ht1_2;
  AssertionResult gtest_ar;
  TypeParam ht2_1;
  TypeParam ht1_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff7c0;
  uint *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  key_equal *in_stack_fffffffffffff7d8;
  int line;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  undefined4 in_stack_fffffffffffff7e8;
  Type in_stack_fffffffffffff7ec;
  Type type;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff7f0;
  char *in_stack_fffffffffffff820;
  char *in_stack_fffffffffffff828;
  char *in_stack_fffffffffffff830;
  AssertionResult *in_stack_fffffffffffff838;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_02;
  undefined6 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff846;
  AssertionResult local_750 [2];
  size_type local_730;
  undefined4 local_724;
  AssertionResult local_720;
  value_type *in_stack_fffffffffffff8f8;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff900;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_6b0;
  Hasher local_6a0;
  Hasher local_694 [14];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_5e8;
  Hasher local_5d8;
  Hasher local_5cc [15];
  size_type local_510;
  undefined4 local_504;
  AssertionResult local_500 [6];
  value_type local_494;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_490;
  Hasher local_480;
  Hasher local_474 [14];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3c8;
  Hasher local_3b8;
  Hasher local_3ac [14];
  string local_300 [55];
  undefined1 local_2c9;
  AssertionResult local_2c8;
  string local_2b8 [55];
  byte local_281;
  AssertionResult local_280 [6];
  value_type local_214;
  value_type local_1b4;
  key_type local_1b0;
  key_type local_1ac;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1a8;
  Hasher local_198;
  Hasher local_18c [15];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  Hasher local_b4 [15];
  
  Hasher::Hasher(local_b4,0);
  Hasher::Hasher(&local_c0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff7f0,CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
             ,(hasher *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             in_stack_fffffffffffff7d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
  Hasher::Hasher(local_18c,0);
  Hasher::Hasher(&local_198,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_1a8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff7f0,CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
             ,(hasher *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             in_stack_fffffffffffff7d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1a8);
  local_1ac = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff7c0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_1b0 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff7c0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_1b4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  local_214 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  uVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff7c0,
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_281 = ~uVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff7c0,
             (bool *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),(type *)0xb4b001)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_280);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff838,in_stack_fffffffffffff830,in_stack_fffffffffffff828,
               in_stack_fffffffffffff820);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
               (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
               (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff846,in_stack_fffffffffffff840)),
               (Message *)in_stack_fffffffffffff838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7c0);
    std::__cxx11::string::~string(local_2b8);
    testing::Message::~Message((Message *)0xb4b145);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4b1dc);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff7c0,
              (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  uVar3 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff7c0,
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_2c9 = uVar3;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff7c0,
             (bool *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),(type *)0xb4b23a)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff838,in_stack_fffffffffffff830,in_stack_fffffffffffff828,
               in_stack_fffffffffffff820);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
               (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
               (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar3,in_stack_fffffffffffff840)),
               (Message *)in_stack_fffffffffffff838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7c0);
    std::__cxx11::string::~string(local_300);
    testing::Message::~Message((Message *)0xb4b30f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4b3a6);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4b3b3);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4b3c0);
  Hasher::Hasher(local_3ac,0);
  Hasher::Hasher(&local_3b8,0);
  this_02 = &local_3c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_02,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff7f0,CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
             ,(hasher *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             in_stack_fffffffffffff7d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_3c8);
  Hasher::Hasher(local_474,0);
  Hasher::Hasher(&local_480,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_490,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff7f0,CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
             ,(hasher *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             in_stack_fffffffffffff7d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_490);
  local_494 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff7c0,
              (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_504 = 0;
  local_510 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xb4b51f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff7d8,
             (char *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             in_stack_fffffffffffff7c8,(unsigned_long *)in_stack_fffffffffffff7c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_500);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7f0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb4b635);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
               (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
               (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar3,in_stack_fffffffffffff840)),
               (Message *)this_02);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7c0);
    testing::Message::~Message((Message *)0xb4b692);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4b703);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4b710);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4b71d);
  type = kSuccess;
  Hasher::Hasher(local_5cc,0);
  Hasher::Hasher(&local_5d8,type);
  this_01 = (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(ulong)type;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_5e8,type,(int *)this_01);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (this_01,CONCAT44(type,in_stack_fffffffffffff7e8),
             (hasher *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             in_stack_fffffffffffff7d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_5e8);
  Hasher::Hasher(local_694,0);
  Hasher::Hasher(&local_6a0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_6b0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (this_01,CONCAT44(type,in_stack_fffffffffffff7e8),
             (hasher *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             in_stack_fffffffffffff7d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_6b0);
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff7c0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  vVar4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff7c0,
              (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_724 = 1;
  local_730 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xb4b8b0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff7d8,
             (char *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             in_stack_fffffffffffff7c8,(unsigned_long *)in_stack_fffffffffffff7c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_720);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff7d8 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb4b9c6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)CONCAT44(vVar4,in_stack_fffffffffffff7e0),
               (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar3,in_stack_fffffffffffff840)),
               (Message *)this_02);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7c0);
    testing::Message::~Message((Message *)0xb4ba23);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4ba94);
  kVar5 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc);
  lhs = (uint *)google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff7c0,
                        (key_type *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff7d8,(char *)CONCAT44(kVar5,in_stack_fffffffffffff7d0),lhs
             ,(unsigned_long *)in_stack_fffffffffffff7c0);
  line = (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_750);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb4bb5e)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)CONCAT44(vVar4,in_stack_fffffffffffff7e0),line,
               (char *)CONCAT44(kVar5,in_stack_fffffffffffff7d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,CONCAT16(uVar3,in_stack_fffffffffffff840)),
               (Message *)this_02);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xb4bbbb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4bc26);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4bc33);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4bc40);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}